

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_rb_struct_declaration
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  bool bVar1;
  t_rb_ofstream *ptVar2;
  ostream *poVar3;
  string local_48;
  byte local_21;
  t_struct *ptStack_20;
  bool is_exception_local;
  t_struct *tstruct_local;
  t_rb_ofstream *out_local;
  t_rb_generator *this_local;
  
  local_21 = is_exception;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (t_rb_ofstream *)this;
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"class ");
  type_name_abi_cxx11_(&local_48,this,&ptStack_20->super_t_type);
  std::operator<<(poVar3,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = t_struct::is_union(ptStack_20);
  if (bVar1) {
    std::operator<<((ostream *)tstruct_local," < ::Thrift::Union");
  }
  if ((local_21 & 1) != 0) {
    std::operator<<((ostream *)tstruct_local," < ::Thrift::Exception");
  }
  poVar3 = std::operator<<((ostream *)tstruct_local,"; end");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct_declaration(t_rb_ofstream& out, t_struct* tstruct, bool is_exception) {
  out.indent() << "class " << type_name(tstruct);
  if (tstruct->is_union()) {
    out << " < ::Thrift::Union";
  }
  if (is_exception) {
    out << " < ::Thrift::Exception";
  }
  out << "; end" << endl << endl;
}